

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

tm * http_gmtime(time_t timer,tm *tm)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  
  *(undefined8 *)&tm->tm_isdst = 0;
  tm->tm_gmtoff = 0;
  tm->tm_mon = 0;
  tm->tm_year = 0;
  tm->tm_wday = 0;
  tm->tm_yday = 0;
  tm->tm_sec = 0;
  tm->tm_min = 0;
  tm->tm_hour = 0;
  tm->tm_mday = 0;
  tm->tm_zone = (char *)0x0;
  if (timer < 0) {
    lVar3 = timer / 0x3c;
    if (timer % 0x3c == 0) {
      tm->tm_sec = 0;
    }
    else {
      tm->tm_sec = (int)(timer % 0x3c) + 0x3c;
      lVar3 = lVar3 + -1;
    }
    lVar10 = lVar3 / 0x3c;
    if (lVar3 % 0x3c == 0) {
      tm->tm_min = 0;
    }
    else {
      tm->tm_min = (int)(lVar3 % 0x3c) + 0x3c;
      lVar10 = lVar10 + -1;
    }
    uVar6 = (lVar10 / 6 + (lVar10 >> 0x3f) >> 2) - (lVar10 >> 0x3f);
    lVar10 = lVar10 + uVar6 * -0x18;
    if (lVar10 == 0) {
      tm->tm_hour = 0;
    }
    else {
      tm->tm_hour = (int)lVar10 + 0x18;
      uVar6 = uVar6 - 1;
    }
    lVar3 = uVar6 + ((long)(uVar6 - 3) / 7) * -7 + -3;
    iVar2 = (int)lVar3;
    tm->tm_wday = iVar2;
    if (lVar3 != 0) {
      tm->tm_wday = iVar2 + 7;
    }
  }
  else {
    uVar6 = (ulong)timer / 0x15180;
    iVar11 = (int)((ulong)timer / 0xe10);
    iVar2 = (int)((ulong)timer / 0x3c);
    tm->tm_sec = (int)timer + iVar2 * -0x3c;
    tm->tm_min = iVar11 * -0x3c + iVar2;
    tm->tm_hour = (int)uVar6 * -0x18 + iVar11;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6 + 4;
    tm->tm_wday = (int)(uVar6 + 4) + SUB164(auVar1 * ZEXT816(0x2492492492492493),8) * -7;
  }
  lVar3 = uVar6 + 0x8bfbc;
  if (-0xafa6d < (long)uVar6) {
    lVar3 = uVar6 + 0xafa6c;
  }
  uVar8 = (int)(uVar6 + 0xafa6c) + (int)(lVar3 / 0x23ab1) * -0x23ab1;
  uVar4 = (((uVar8 >> 2) / 0x23ab + uVar8) - (uVar8 / 0x23ab0 + (uVar8 >> 2) / 0x16d)) / 0x16d;
  uVar5 = uVar4 & 0xffff;
  uVar12 = ((uVar4 * -0x16d + uVar8) - (uVar5 >> 2)) + uVar5 / 100;
  uVar4 = uVar12 & 0xffff;
  uVar8 = uVar4 * 5 + 2;
  uVar9 = uVar8 / 0x99;
  bVar7 = (char)uVar9 + 2;
  if (0x131 < uVar4) {
    bVar7 = (char)(uVar8 / 0x99) - 10;
  }
  uVar6 = (lVar3 / 0x23ab1) * 400 + (ulong)uVar5 + (ulong)(bVar7 < 2);
  tm->tm_year = (int)uVar6 + -0x76c;
  tm->tm_mon = (uint)bVar7;
  tm->tm_mday = (uVar12 - (uVar9 * 0x99 + 2) / 5) + 1 & 0xffff;
  uVar5 = 0;
  if ((uVar6 & 3) == 0) {
    lVar3 = uVar6 * -0x70a3d70a3d70a3d7;
    uVar5 = 1;
    if ((lVar3 + 0x51eb851eb851eb8U >> 2 | lVar3 << 0x3e) < 0x28f5c28f5c28f5d) {
      uVar5 = (uint)((lVar3 + 0x51eb851eb851eb0U >> 4 | lVar3 << 0x3c) < 0xa3d70a3d70a3d7);
    }
  }
  tm->tm_yday = (uVar4 + uVar5 + 0x3b) % (uVar5 + 0x16d);
  return tm;
}

Assistant:

struct tm *http_gmtime(time_t timer, struct tm *tm) {
  ssize_t a, b;
#if HAVE_TM_TM_ZONE || defined(BSD)
  *tm = (struct tm){
      .tm_isdst = 0,
      .tm_zone = (char *)"UTC",
  };
#else
  *tm = (struct tm){
      .tm_isdst = 0,
  };
#endif

  // convert seconds from epoch to days from epoch + extract data
  if (timer >= 0) {
    // for seconds up to weekdays, we reduce the reminder every step.
    a = (ssize_t)timer;
    b = a / 60; // b == time in minutes
    tm->tm_sec = a - (b * 60);
    a = b / 60; // b == time in hours
    tm->tm_min = b - (a * 60);
    b = a / 24; // b == time in days since epoch
    tm->tm_hour = a - (b * 24);
    // b == number of days since epoch
    // day of epoch was a thursday. Add + 4 so sunday == 0...
    tm->tm_wday = (b + 4) % 7;
  } else {
    // for seconds up to weekdays, we reduce the reminder every step.
    a = (ssize_t)timer;
    b = a / 60; // b == time in minutes
    if (b * 60 != a) {
      /* seconds passed */
      tm->tm_sec = (a - (b * 60)) + 60;
      --b;
    } else {
      /* no seconds */
      tm->tm_sec = 0;
    }
    a = b / 60; // b == time in hours
    if (a * 60 != b) {
      /* minutes passed */
      tm->tm_min = (b - (a * 60)) + 60;
      --a;
    } else {
      /* no minutes */
      tm->tm_min = 0;
    }
    b = a / 24; // b == time in days since epoch?
    if (b * 24 != a) {
      /* hours passed */
      tm->tm_hour = (a - (b * 24)) + 24;
      --b;
    } else {
      /* no hours */
      tm->tm_hour = 0;
    }
    // day of epoch was a thursday. Add + 4 so sunday == 0...
    tm->tm_wday = ((b - 3) % 7);
    if (tm->tm_wday)
      tm->tm_wday += 7;
    /* b == days from epoch */
  }

  // at this point we can apply the algorithm described here:
  // http://howardhinnant.github.io/date_algorithms.html#civil_from_days
  // Credit to Howard Hinnant.
  {
    b += 719468L; // adjust to March 1st, 2000 (post leap of 400 year era)
    // 146,097 = days in era (400 years)
    const size_t era = (b >= 0 ? b : b - 146096) / 146097;
    const uint32_t doe = (b - (era * 146097)); // day of era
    const uint16_t yoe =
        (doe - doe / 1460 + doe / 36524 - doe / 146096) / 365; // year of era
    a = yoe;
    a += era * 400; // a == year number, assuming year starts on March 1st...
    const uint16_t doy = doe - (365 * yoe + yoe / 4 - yoe / 100);
    const uint16_t mp = (5U * doy + 2) / 153;
    const uint16_t d = doy - (153U * mp + 2) / 5 + 1;
    const uint8_t m = mp + (mp < 10 ? 2 : -10);
    a += (m <= 1);
    tm->tm_year = a - 1900; // tm_year == years since 1900
    tm->tm_mon = m;
    tm->tm_mday = d;
    const uint8_t is_leap = (a % 4 == 0 && (a % 100 != 0 || a % 400 == 0));
    tm->tm_yday = (doy + (is_leap) + 28 + 31) % (365 + is_leap);
  }

  return tm;
}